

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

lyd_node * lyd_create_leaf(lys_node *schema,char *val_str,int dflt)

{
  undefined2 uVar1;
  int iVar2;
  LY_ERR *pLVar3;
  lys_module *plVar4;
  char *local_40;
  lyd_node_leaf_list *ret;
  int dflt_local;
  char *val_str_local;
  lys_node *schema_local;
  
  schema_local = (lys_node *)calloc(1,0x48);
  if (schema_local == (lys_node *)0x0) {
    pLVar3 = ly_errno_location();
    *pLVar3 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_create_leaf");
    schema_local = (lys_node *)0x0;
  }
  else {
    schema_local->name = (char *)schema;
    iVar2 = ly_new_node_validity(schema);
    *(char *)&schema_local->dsc = (char)iVar2;
    iVar2 = resolve_applies_when(schema,0,(lys_node *)0x0);
    if (iVar2 != 0) {
      *(byte *)((long)&schema_local->dsc + 1) = *(byte *)((long)&schema_local->dsc + 1) & 0xf1 | 8;
    }
    schema_local->ext = (lys_ext_instance **)schema_local;
    uVar1 = schema[1].flags;
    *(undefined2 *)&schema_local->parent = uVar1;
    local_40 = val_str;
    if (val_str == (char *)0x0) {
      local_40 = "";
    }
    plVar4 = (lys_module *)lydict_insert(schema->module->ctx,local_40,0);
    schema_local->module = plVar4;
    *(byte *)((long)&schema_local->dsc + 1) =
         *(byte *)((long)&schema_local->dsc + 1) & 0xfe | (byte)dflt & 1;
  }
  return (lyd_node *)schema_local;
}

Assistant:

static struct lyd_node *
lyd_create_leaf(const struct lys_node *schema, const char *val_str, int dflt)
{
    struct lyd_node_leaf_list *ret;

    ret = calloc(1, sizeof *ret);
    if (!ret) {
        LOGMEM;
        return NULL;
    }
    ret->schema = (struct lys_node *)schema;
    ret->validity = ly_new_node_validity(schema);
    if (resolve_applies_when(schema, 0, NULL)) {
        ret->when_status = LYD_WHEN;
    }
    ret->prev = (struct lyd_node *)ret;
    ret->value_type = ((struct lys_node_leaf *)schema)->type.base;
    ret->value_str = lydict_insert(schema->module->ctx, val_str ? val_str : "", 0);
    ret->dflt = dflt;

    return (struct lyd_node *)ret;
}